

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterSystem.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,UnderwaterAcousticEmitterSystem *this)

{
  pointer pUVar1;
  ostream *poVar2;
  pointer pUVar3;
  KStringStream ss;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"Underwater Acoustic Emitter System:",0x23);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n\tData Length:       ",0x15);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tNumber Of Beams:   ",0x15);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  AcousticEmitterSystem::GetAsString_abi_cxx11_(&local_1f8,&this->m_AES);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tLocation:          ",0x15);
  Vector::GetAsString_abi_cxx11_(&local_1d8,&this->m_Location);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  pUVar1 = (this->m_vUAEB).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pUVar3 = (this->m_vUAEB).
                super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
                ._M_impl.super__Vector_impl_data._M_start; pUVar3 != pUVar1; pUVar3 = pUVar3 + 1) {
    (*(pUVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_1f8,pUVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

KString UnderwaterAcousticEmitterSystem::GetAsString() const
{
    KStringStream ss;

    ss << "Underwater Acoustic Emitter System:"
       << "\n\tData Length:       " << ( KUINT16 )m_ui8EmitterSystemDataLength
       << "\n\tNumber Of Beams:   " << ( KUINT16 )m_ui8NumBeams
       << m_AES.GetAsString()
       << "\n\tLocation:          " << m_Location.GetAsString();

    vector<UnderwaterAcousticEmitterBeam>::const_iterator citr = m_vUAEB.begin();
    vector<UnderwaterAcousticEmitterBeam>::const_iterator citrEnd = m_vUAEB.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString();
    }

    return ss.str();
}